

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::handleTransformations(QPDFJob *this,QPDF *pdf)

{
  string *name;
  pointer pPVar1;
  QPDF *pQVar2;
  bool bVar3;
  int __val;
  element_type *peVar4;
  runtime_error *prVar5;
  byte bVar6;
  QPDFPageObjectHelper *ph;
  QPDFPageObjectHelper *pQVar7;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar8;
  int iVar9;
  pointer pPVar10;
  int iVar11;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar12;
  string_view prefix;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle page_labels;
  shared_ptr<QPDFAcroFormDocumentHelper> afdh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  QPDFObjectHandle nums;
  anon_class_16_2_622ee4b4 make_afdh;
  QPDFPageDocumentHelper dh;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&dh,pdf);
  make_afdh.afdh = &afdh;
  afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_afdh.pdf = pdf;
  if (peVar4->remove_restrictions == true) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()(&make_afdh);
    QPDFAcroFormDocumentHelper::disableDigitalSignatures
              (afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar4->externalize_inline_images != false) ||
     ((bVar6 = peVar4->optimize_images, (bool)bVar6 == true && (peVar4->keep_inline_images == false)
      ))) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh,&dh);
    pQVar2 = efdh.super_QPDFDocumentHelper.qpdf;
    for (pQVar7 = (QPDFPageObjectHelper *)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
        pQVar7 != (QPDFPageObjectHelper *)pQVar2; pQVar7 = pQVar7 + 1) {
      QPDFPageObjectHelper::externalizeInlineImages
                (pQVar7,((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->ii_min_bytes,false);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar6 = peVar4->optimize_images;
  }
  if ((bVar6 & 1) != 0) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh,&dh);
    pQVar2 = efdh.super_QPDFDocumentHelper.qpdf;
    iVar9 = 1;
    for (pQVar7 = (QPDFPageObjectHelper *)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
        pQVar7 != (QPDFPageObjectHelper *)pQVar2; pQVar7 = pQVar7 + 1) {
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_d8._M_unused._M_object = operator_new(0x18);
      *(QPDFJob **)local_d8._M_unused._0_8_ = this;
      *(int *)((long)local_d8._M_unused._0_8_ + 8) = iVar9;
      *(QPDF **)((long)local_d8._M_unused._0_8_ + 0x10) = pdf;
      pcStack_c0 = std::
                   _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                 ::_M_manager;
      QPDFPageObjectHelper::forEachImage
                (pQVar7,true,
                 (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      iVar9 = iVar9 + 1;
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar4->generate_appearances == true) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()(&make_afdh);
    QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded
              (afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar4->flatten_annotations == true) {
    QPDFPageDocumentHelper::flattenAnnotations
              (&dh,peVar4->flatten_annotations_required,peVar4->flatten_annotations_forbidden);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar4->coalesce_contents == true) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh,&dh);
    pQVar2 = efdh.super_QPDFDocumentHelper.qpdf;
    for (pQVar7 = (QPDFPageObjectHelper *)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
        pQVar7 != (QPDFPageObjectHelper *)pQVar2; pQVar7 = pQVar7 + 1) {
      QPDFPageObjectHelper::coalesceContentStreams(pQVar7);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar4->flatten_rotation == true) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()(&make_afdh);
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh,&dh);
    pQVar2 = efdh.super_QPDFDocumentHelper.qpdf;
    for (pQVar7 = (QPDFPageObjectHelper *)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
        pQVar7 != (QPDFPageObjectHelper *)pQVar2; pQVar7 = pQVar7 + 1) {
      QPDFPageObjectHelper::flattenRotation
                (pQVar7,afdh.
                        super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar4->remove_page_labels == true) {
    QPDF::getRoot((QPDF *)&page_labels);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efdh,"/PageLabels",(allocator<char> *)&local_138);
    QPDFObjectHandle::removeKey(&page_labels,(string *)&efdh);
    std::__cxx11::string::~string((string *)&efdh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page_labels.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((peVar4->page_label_specs).
      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar4->page_label_specs).
               super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>.
               _M_impl.super__Vector_impl_data + 8)) {
    QPDFObjectHandle::newArray();
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh,&dh);
    page_labels.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (((long)efdh.super_QPDFDocumentHelper.qpdf -
              (long)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper) / 0x38);
    __val = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                      ((unsigned_long *)&page_labels);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar1 = *(pointer *)
              ((long)&(peVar4->page_label_specs).
                      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>
                      ._M_impl.super__Vector_impl_data + 8);
    iVar9 = 0;
    for (pPVar10 = (peVar4->page_label_specs).
                   super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar10 != pPVar1;
        pPVar10 = pPVar10 + 1) {
      iVar11 = pPVar10->first_page;
      if (iVar11 < 0) {
        iVar11 = iVar11 + __val + 1;
        pPVar10->first_page = iVar11;
      }
      if (iVar9 == 0) {
        if (iVar11 != 1) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"the first page label specification must start with page 1");
          goto LAB_00160b50;
        }
      }
      else if (iVar11 <= iVar9) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar5,"page label specifications must be in order by first page");
LAB_00160b50:
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (__val < iVar11) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_50,pPVar10->first_page);
        std::operator+(&local_90,"page label spec: page ",&local_50);
        std::operator+(&local_138,&local_90," is more than the total number of pages (");
        std::__cxx11::to_string(&local_70,__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &page_labels,&local_138,&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efdh,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &page_labels,")");
        std::runtime_error::runtime_error(prVar5,(string *)&efdh);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      QPDFObjectHandle::newInteger((longlong)efdh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper)
      ;
      QPDFObjectHandle::appendItem(&nums,(QPDFObjectHandle *)&efdh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&efdh.super_QPDFDocumentHelper.qpdf);
      prefix._M_len = (ulong)(uint)pPVar10->start_num;
      prefix._M_str = (char *)(pPVar10->prefix)._M_string_length;
      QPDFPageLabelDocumentHelper::pageLabelDict
                ((qpdf_page_label_e)&efdh,pPVar10->label_type,prefix);
      QPDFObjectHandle::appendItem(&nums,(QPDFObjectHandle *)&efdh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&efdh.super_QPDFDocumentHelper.qpdf);
      iVar9 = iVar11;
    }
    QPDFObjectHandle::newDictionary();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efdh,"/Nums",(allocator<char> *)&local_138);
    QPDFObjectHandle::replaceKey(&page_labels,(string *)&efdh,&nums);
    std::__cxx11::string::~string((string *)&efdh);
    QPDF::getRoot((QPDF *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&efdh,"/PageLabels",(allocator<char> *)&local_90);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_138,(string *)&efdh,&page_labels);
    std::__cxx11::string::~string((string *)&efdh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page_labels.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nums.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)*(undefined1 **)
          &(peVar4->attachments_to_remove).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base != &peVar4->attachments_to_remove) {
    QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
    plVar8 = &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              attachments_to_remove;
    plVar12 = plVar8;
    while (plVar12 = *(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       **)&(plVar12->
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl._M_node.super__List_node_base, plVar12 != plVar8) {
      name = (string *)
             &(plVar12->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
      bVar3 = QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile(&efdh,name);
      if (!bVar3) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_138,"attachment ",name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &page_labels,&local_138," not found");
        std::runtime_error::runtime_error(prVar5,(string *)&page_labels);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_b0._8_8_ = 0;
      local_98 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                 ::_M_invoke;
      local_a0 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                 ::_M_manager;
      local_b0._M_unused._M_object = name;
      doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_b0);
      std::_Function_base::~_Function_base((_Function_base *)&local_b0);
    }
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)
      *(undefined1 **)
       &(peVar4->attachments_to_add).
        super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl.
        _M_node.super__List_node_base != &peVar4->attachments_to_add) {
    addAttachments(this,pdf);
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *)
      *(undefined1 **)
       &(peVar4->attachments_to_copy).
        super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
        _M_impl._M_node.super__List_node_base != &peVar4->attachments_to_copy) {
    copyAttachments(this,pdf);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
  return;
}

Assistant:

void
QPDFJob::handleTransformations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdh;
    auto make_afdh = [&]() {
        if (!afdh.get()) {
            afdh = std::make_shared<QPDFAcroFormDocumentHelper>(pdf);
        }
    };
    if (m->remove_restrictions) {
        make_afdh();
        afdh->disableDigitalSignatures();
    }
    if (m->externalize_inline_images || (m->optimize_images && (!m->keep_inline_images))) {
        for (auto& ph: dh.getAllPages()) {
            ph.externalizeInlineImages(m->ii_min_bytes);
        }
    }
    if (m->optimize_images) {
        int pageno = 0;
        for (auto& ph: dh.getAllPages()) {
            ++pageno;
            ph.forEachImage(
                true,
                [this, pageno, &pdf](
                    QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
                    auto io = std::make_unique<ImageOptimizer>(
                        *this,
                        m->oi_min_width,
                        m->oi_min_height,
                        m->oi_min_area,
                        m->jpeg_quality,
                        obj);
                    if (io->evaluate("image " + key + " on page " + std::to_string(pageno))) {
                        QPDFObjectHandle new_image = pdf.newStream();
                        new_image.replaceDict(obj.getDict().shallowCopy());
                        new_image.replaceStreamData(
                            std::move(io),
                            QPDFObjectHandle::newName("/DCTDecode"),
                            QPDFObjectHandle::newNull());
                        xobj_dict.replaceKey(key, new_image);
                    }
                });
        }
    }
    if (m->generate_appearances) {
        make_afdh();
        afdh->generateAppearancesIfNeeded();
    }
    if (m->flatten_annotations) {
        dh.flattenAnnotations(m->flatten_annotations_required, m->flatten_annotations_forbidden);
    }
    if (m->coalesce_contents) {
        for (auto& page: dh.getAllPages()) {
            page.coalesceContentStreams();
        }
    }
    if (m->flatten_rotation) {
        make_afdh();
        for (auto& page: dh.getAllPages()) {
            page.flattenRotation(afdh.get());
        }
    }
    if (m->remove_page_labels) {
        pdf.getRoot().removeKey("/PageLabels");
    }
    if (!m->page_label_specs.empty()) {
        auto nums = QPDFObjectHandle::newArray();
        auto n_pages = QIntC::to_int(dh.getAllPages().size());
        int last_page_seen{0};
        for (auto& spec: m->page_label_specs) {
            if (spec.first_page < 0) {
                spec.first_page = n_pages + 1 + spec.first_page;
            }
            if (last_page_seen == 0) {
                if (spec.first_page != 1) {
                    throw std::runtime_error(
                        "the first page label specification must start with page 1");
                }
            } else if (spec.first_page <= last_page_seen) {
                throw std::runtime_error(
                    "page label specifications must be in order by first page");
            }
            if (spec.first_page > n_pages) {
                throw std::runtime_error(
                    "page label spec: page " + std::to_string(spec.first_page) +
                    " is more than the total number of pages (" + std::to_string(n_pages) + ")");
            }
            last_page_seen = spec.first_page;
            nums.appendItem(QPDFObjectHandle::newInteger(spec.first_page - 1));
            nums.appendItem(
                QPDFPageLabelDocumentHelper::pageLabelDict(
                    spec.label_type, spec.start_num, spec.prefix));
        }
        auto page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", nums);
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }
    if (!m->attachments_to_remove.empty()) {
        QPDFEmbeddedFileDocumentHelper efdh(pdf);
        for (auto const& key: m->attachments_to_remove) {
            if (efdh.removeEmbeddedFile(key)) {
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << prefix << ": removed attachment " << key << "\n";
                });
            } else {
                throw std::runtime_error("attachment " + key + " not found");
            }
        }
    }
    if (!m->attachments_to_add.empty()) {
        addAttachments(pdf);
    }
    if (!m->attachments_to_copy.empty()) {
        copyAttachments(pdf);
    }
}